

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.hpp
# Opt level: O0

void __thiscall Tokenizer::Tokenizer(Tokenizer *this,shared_ptr<Readable> *reader)

{
  int local_24 [3];
  shared_ptr<Readable> *local_18;
  shared_ptr<Readable> *reader_local;
  Tokenizer *this_local;
  
  local_18 = reader;
  reader_local = &this->reader;
  std::shared_ptr<Readable>::shared_ptr(&this->reader,reader);
  this->sourceIndex = 0;
  this->sourceLine = 1;
  this->sourceColumn = 1;
  local_24[2] = 0;
  local_24[1] = 0;
  local_24[0] = 0;
  std::make_shared<Token,char_const(&)[8],TokenType,int,int,int>
            ((char (*) [8])&this->token,(TokenType *)"Unknown",local_24 + 2,local_24 + 1,local_24);
  return;
}

Assistant:

explicit Tokenizer(std::shared_ptr<Readable> reader) noexcept
  : reader{std::move(reader)},
    sourceIndex{0},
    sourceLine{1},
    sourceColumn{1},
    token{std::make_shared<Token>("Unknown", TokenType::Unknown, 0, 0, 0)}
  {}